

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

xmlChar * xmlEscapeFormatString(xmlChar **msg)

{
  xmlChar *pxVar1;
  size_t resultLen;
  size_t msgLen;
  size_t count;
  xmlChar *resultPtr;
  xmlChar *result;
  xmlChar *msgPtr;
  xmlChar **msg_local;
  
  msgLen = 0;
  resultLen = 0;
  if ((msg == (xmlChar **)0x0) || (*msg == (xmlChar *)0x0)) {
    msg_local = (xmlChar **)0x0;
  }
  else {
    for (result = *msg; *result != '\0'; result = result + 1) {
      resultLen = resultLen + 1;
      if (*result == '%') {
        msgLen = msgLen + 1;
      }
    }
    if (msgLen == 0) {
      msg_local = (xmlChar **)*msg;
    }
    else if ((msgLen < 0x80000000) && (resultLen <= 0x7fffffff - msgLen)) {
      pxVar1 = (xmlChar *)(*xmlMalloc)(resultLen + msgLen + 1);
      if (pxVar1 == (xmlChar *)0x0) {
        (*xmlFree)(*msg);
        *msg = (xmlChar *)0x0;
        msg_local = (xmlChar **)0x0;
      }
      else {
        count = (size_t)pxVar1;
        for (result = *msg; *result != '\0'; result = result + 1) {
          *(xmlChar *)count = *result;
          if (*result == '%') {
            *(undefined1 *)(count + 1) = 0x25;
            count = count + 1;
          }
          count = count + 1;
        }
        pxVar1[resultLen + msgLen] = '\0';
        (*xmlFree)(*msg);
        *msg = pxVar1;
        msg_local = (xmlChar **)*msg;
      }
    }
    else {
      msg_local = (xmlChar **)0x0;
    }
  }
  return (xmlChar *)msg_local;
}

Assistant:

xmlChar *
xmlEscapeFormatString(xmlChar **msg)
{
    xmlChar *msgPtr = NULL;
    xmlChar *result = NULL;
    xmlChar *resultPtr = NULL;
    size_t count = 0;
    size_t msgLen = 0;
    size_t resultLen = 0;

    if (!msg || !*msg)
        return(NULL);

    for (msgPtr = *msg; *msgPtr != '\0'; ++msgPtr) {
        ++msgLen;
        if (*msgPtr == '%')
            ++count;
    }

    if (count == 0)
        return(*msg);

    if ((count > INT_MAX) || (msgLen > INT_MAX - count))
        return(NULL);
    resultLen = msgLen + count + 1;
    result = xmlMalloc(resultLen);
    if (result == NULL) {
        /* Clear *msg to prevent format string vulnerabilities in
           out-of-memory situations. */
        xmlFree(*msg);
        *msg = NULL;
        return(NULL);
    }

    for (msgPtr = *msg, resultPtr = result; *msgPtr != '\0'; ++msgPtr, ++resultPtr) {
        *resultPtr = *msgPtr;
        if (*msgPtr == '%')
            *(++resultPtr) = '%';
    }
    result[resultLen - 1] = '\0';

    xmlFree(*msg);
    *msg = result;

    return *msg;
}